

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

nifti_image * nifti_image_from_ascii(char *str,int *bytes_read)

{
  float dx;
  float dy;
  float dz;
  char cVar1;
  int iVar2;
  int iVar3;
  mat44 R;
  mat44 R_00;
  nifti_image *pnVar4;
  int iVar5;
  nifti_image *nim;
  char *pcVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  float qfac;
  uint local_984;
  ushort **local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  char *local_938;
  char *local_930;
  char *local_928;
  float *local_920;
  nifti_image *local_918;
  float *local_910;
  float *local_908;
  float *local_900;
  float (*local_8f8) [4];
  float *local_8f0;
  float *local_8e8;
  float *local_8e0;
  float (*local_8d8) [4];
  float *local_8d0;
  float *local_8c8;
  float *local_8c0;
  float (*local_8b8) [4];
  float *local_8b0;
  float *local_8a8;
  float *local_8a0;
  mat44 *local_898;
  int *local_890;
  char *local_888;
  char *local_880;
  uint val;
  float fStack_874;
  float afStack_870 [2];
  float local_868 [2];
  float afStack_860 [2];
  float local_858 [2];
  float afStack_850 [2];
  float local_848 [2];
  float afStack_840 [2];
  char lhs [1024];
  char rhs [1024];
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    iVar5 = __isoc99_sscanf(str,"%1023s%n",lhs,&local_984);
    uVar8 = local_984;
    if (iVar5 == 0) {
      return (nifti_image *)0x0;
    }
    if (CONCAT17(lhs[0xc],CONCAT16(lhs[0xb],CONCAT15(lhs[10],CONCAT14(lhs[9],CONCAT13(lhs[8],
                                                  CONCAT12(lhs[7],CONCAT11(lhs[6],lhs[5]))))))) ==
        0x6567616d695f69 &&
        CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3],CONCAT12(lhs
                                                  [2],CONCAT11(lhs[1],lhs[0]))))))) ==
        0x695f697466696e3c) {
      local_890 = bytes_read;
      nim = (nifti_image *)calloc(1,0x2b8);
      if (nim != (nifti_image *)0x0) {
        nim->nw = 1;
        nim->nu = 1;
        nim->nv = 1;
        nim->nz = 1;
        nim->nt = 1;
        nim->nx = 1;
        nim->ny = 1;
        local_920 = &nim->dx;
        nim->dx = 0.0;
        nim->dy = 0.0;
        nim->dz = 0.0;
        nim->dt = 0.0;
        nim->dt = 0.0;
        nim->du = 0.0;
        nim->dv = 0.0;
        nim->dw = 0.0;
        nim->qfac = 1.0;
        nim->byteorder = 1;
        local_980 = __ctype_b_loc();
        local_938 = nim->aux_file;
        local_930 = nim->descrip;
        local_928 = nim->intent_name;
        local_898 = &nim->sto_xyz;
        local_8a0 = (nim->sto_xyz).m[0] + 1;
        local_8a8 = (nim->sto_xyz).m[0] + 2;
        local_8b0 = (nim->sto_xyz).m[0] + 3;
        local_8b8 = (nim->sto_xyz).m + 1;
        local_8c0 = (nim->sto_xyz).m[1] + 1;
        local_8c8 = (nim->sto_xyz).m[1] + 2;
        local_8d0 = (nim->sto_xyz).m[1] + 3;
        local_8d8 = (nim->sto_xyz).m + 2;
        local_8e0 = (nim->sto_xyz).m[2] + 1;
        local_8e8 = (nim->sto_xyz).m[2] + 2;
        local_8f0 = (nim->sto_xyz).m[2] + 3;
        local_8f8 = (nim->sto_xyz).m + 3;
        local_900 = (nim->sto_xyz).m[3] + 1;
        local_908 = (nim->sto_xyz).m[3] + 2;
        local_910 = (nim->sto_xyz).m[3] + 3;
        local_880 = str + -1;
        local_888 = str + 1;
        local_918 = nim;
        while( true ) {
          uVar17 = (ulong)(uVar8 - 1);
          pcVar11 = local_880 + (int)uVar8;
          uVar18 = uVar8;
          do {
            uVar9 = uVar18;
            uVar8 = uVar8 + 1;
            pcVar6 = pcVar11 + 1;
            pcVar11 = pcVar11 + 1;
            uVar14 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar14;
            uVar18 = uVar9 + 1;
          } while ((*(byte *)((long)*local_980 + (long)*pcVar6 * 2 + 1) & 0x20) != 0);
          if (*pcVar6 == '\0') goto LAB_00111d3d;
          iVar5 = __isoc99_sscanf(pcVar11,"%1023s%n",lhs,&local_984);
          if ((iVar5 == 0) || (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x3e2f)) break;
          lVar15 = (long)(int)(uVar9 + local_984);
          pcVar11 = local_888 + lVar15;
          uVar17 = lVar15 - 1;
          uVar8 = uVar8 + local_984;
          do {
            do {
              uVar18 = uVar8;
              uVar16 = uVar17;
              pcVar6 = pcVar11;
              cVar1 = str[uVar16 + 1];
              uVar17 = uVar16 + 1;
              uVar8 = uVar18 + 1;
              pcVar11 = pcVar6 + 1;
            } while ((long)cVar1 == 0x3d);
          } while (((*local_980)[cVar1] & 0x2000) != 0);
          if (cVar1 == '\'') {
            local_984 = 0xffffffff;
            do {
              uVar8 = uVar18;
              cVar1 = *pcVar6;
              uVar18 = uVar8 + 1;
              local_984 = local_984 + 1;
              if (cVar1 == '\'') break;
              pcVar6 = pcVar6 + 1;
            } while (cVar1 != '\0');
            if (0x3fe < (int)local_984) {
              local_984 = 0x3ff;
            }
            sVar7 = (size_t)(int)local_984;
            memcpy(rhs,str + uVar16 + 2,sVar7);
            rhs[sVar7] = '\0';
            if (cVar1 == '\'') {
              uVar8 = uVar18;
            }
          }
          else {
            if (cVar1 == '\0') goto LAB_00111d3d;
            iVar5 = __isoc99_sscanf(str + uVar17,"%1023s%n",rhs,&local_984);
            uVar8 = local_984 + (int)uVar17;
            if (iVar5 == 0) {
              uVar17 = (ulong)uVar8;
LAB_00111d3d:
              pnVar4 = local_918;
              if (local_890 != (int *)0x0) {
                *local_890 = (int)uVar17 + 1;
              }
              if ((0 < nim->ndim) &&
                 (nifti_datatype_sizes(nim->datatype,&local_918->nbyper,&local_918->swapsize),
                 nim->nbyper != 0)) {
                nim->dim[0] = nim->ndim;
                iVar5 = nim->nx;
                nim->dim[1] = iVar5;
                dx = nim->dx;
                nim->pixdim[1] = dx;
                iVar13 = nim->ny;
                nim->dim[2] = iVar13;
                dy = nim->dy;
                nim->pixdim[2] = dy;
                iVar10 = nim->nz;
                nim->dim[3] = iVar10;
                dz = nim->dz;
                nim->pixdim[3] = dz;
                iVar12 = nim->nt;
                nim->dim[4] = iVar12;
                nim->pixdim[4] = nim->dt;
                iVar2 = nim->nu;
                nim->dim[5] = iVar2;
                nim->pixdim[5] = nim->du;
                iVar3 = nim->nv;
                nim->dim[6] = iVar3;
                fVar19 = nim->dw;
                nim->pixdim[6] = nim->dv;
                nim->pixdim[7] = fVar19;
                nim->dim[7] = nim->nw;
                nim->nvox = (long)iVar2 * (long)iVar3 * (long)nim->nw *
                            (long)iVar10 * (long)iVar12 * (long)iVar13 * (long)iVar5;
                if (nim->qform_code < 1) {
                  qfac = 0.0;
                  fVar19 = 0.0;
                  qc = 0.0;
                  qd = 0.0;
                  qx = 0.0;
                  qy = 0.0;
                  qz = 0.0;
                }
                else {
                  fVar19 = nim->quatern_b;
                  qc = nim->quatern_c;
                  qd = nim->quatern_d;
                  qx = nim->qoffset_x;
                  qy = nim->qoffset_y;
                  qz = nim->qoffset_z;
                  qfac = nim->qfac;
                }
                nifti_quatern_to_mat44((mat44 *)&val,fVar19,qc,qd,qx,qy,qz,dx,dy,dz,qfac);
                *(float (*) [2])(pnVar4->qto_xyz).m[3] = local_848;
                *(float (*) [2])((pnVar4->qto_xyz).m[3] + 2) = afStack_840;
                *(float (*) [2])(pnVar4->qto_xyz).m[2] = local_858;
                *(float (*) [2])((pnVar4->qto_xyz).m[2] + 2) = afStack_850;
                *(float (*) [2])(pnVar4->qto_xyz).m[1] = local_868;
                *(float (*) [2])((pnVar4->qto_xyz).m[1] + 2) = afStack_860;
                *(ulong *)(pnVar4->qto_xyz).m[0] = CONCAT44(fStack_874,val);
                *(float (*) [2])((pnVar4->qto_xyz).m[0] + 2) = afStack_870;
                local_978 = *(undefined8 *)(nim->qto_xyz).m[0];
                uStack_970 = *(undefined8 *)((nim->qto_xyz).m[0] + 2);
                local_968 = *(undefined8 *)(nim->qto_xyz).m[1];
                uStack_960 = *(undefined8 *)((nim->qto_xyz).m[1] + 2);
                local_958 = *(undefined8 *)(nim->qto_xyz).m[2];
                uStack_950 = *(undefined8 *)((nim->qto_xyz).m[2] + 2);
                local_948 = *(undefined8 *)(nim->qto_xyz).m[3];
                uStack_940 = *(undefined8 *)((nim->qto_xyz).m[3] + 2);
                R.m[3][1] = (float)(int)((ulong)local_948 >> 0x20);
                R.m._0_52_ = *(undefined1 (*) [52])(nim->qto_xyz).m;
                R.m[3][2] = (float)(int)uStack_940;
                R.m[3][3] = (float)((ulong)uStack_940 >> 0x20);
                nifti_mat44_inverse(R);
                *(float (*) [2])(nim->qto_ijk).m[3] = local_848;
                *(float (*) [2])((nim->qto_ijk).m[3] + 2) = afStack_840;
                *(float (*) [2])(nim->qto_ijk).m[2] = local_858;
                *(float (*) [2])((nim->qto_ijk).m[2] + 2) = afStack_850;
                *(float (*) [2])(nim->qto_ijk).m[1] = local_868;
                *(float (*) [2])((nim->qto_ijk).m[1] + 2) = afStack_860;
                *(ulong *)(nim->qto_ijk).m[0] = CONCAT44(fStack_874,val);
                *(float (*) [2])((nim->qto_ijk).m[0] + 2) = afStack_870;
                if (0 < nim->sform_code) {
                  local_978 = *(undefined8 *)(nim->sto_xyz).m[0];
                  uStack_970 = *(undefined8 *)((nim->sto_xyz).m[0] + 2);
                  local_968 = *(undefined8 *)(nim->sto_xyz).m[1];
                  uStack_960 = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
                  local_958 = *(undefined8 *)(nim->sto_xyz).m[2];
                  uStack_950 = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
                  local_948 = *(undefined8 *)(nim->sto_xyz).m[3];
                  uStack_940 = *(undefined8 *)((nim->sto_xyz).m[3] + 2);
                  R_00.m[3][1] = (float)(int)((ulong)local_948 >> 0x20);
                  R_00.m._0_52_ = *(undefined1 (*) [52])(nim->sto_xyz).m;
                  R_00.m[3][2] = (float)(int)uStack_940;
                  R_00.m[3][3] = (float)((ulong)uStack_940 >> 0x20);
                  nifti_mat44_inverse(R_00);
                  *(float (*) [2])(nim->sto_ijk).m[3] = local_848;
                  *(float (*) [2])((nim->sto_ijk).m[3] + 2) = afStack_840;
                  *(float (*) [2])(nim->sto_ijk).m[2] = local_858;
                  *(float (*) [2])((nim->sto_ijk).m[2] + 2) = afStack_850;
                  *(float (*) [2])(nim->sto_ijk).m[1] = local_868;
                  *(float (*) [2])((nim->sto_ijk).m[1] + 2) = afStack_860;
                  *(ulong *)(nim->sto_ijk).m[0] = CONCAT44(fStack_874,val);
                  *(float (*) [2])((nim->sto_ijk).m[0] + 2) = afStack_870;
                  return nim;
                }
                return nim;
              }
              nifti_image_free(nim);
              return (nifti_image *)0x0;
            }
          }
          sVar7 = strlen(rhs);
          iVar5 = (int)sVar7;
          if (iVar5 != 0) {
            if (iVar5 < 1) {
              uVar17 = 0;
            }
            else {
              uVar17 = 0;
              iVar13 = 0;
              do {
                lVar15 = (long)iVar13;
                cVar1 = rhs[lVar15];
                if (cVar1 == '\r') {
                  cVar1 = rhs[lVar15 + 1];
                  rhs[uVar17] = '\n';
                  iVar10 = iVar13;
                  if (cVar1 == '\n') {
                    iVar10 = iVar13 + 1;
                  }
                  goto LAB_00110c87;
                }
                if (cVar1 == '&') {
                  iVar12 = iVar13 + 3;
                  if (iVar12 < iVar5) {
                    iVar10 = iVar12;
                    if (rhs[lVar15 + 1] == 'g') {
                      if ((rhs[lVar15 + 2] != 't') || (rhs[lVar15 + 3] != ';')) goto LAB_00110b7c;
                      rhs[uVar17] = '>';
                    }
                    else {
                      if (((rhs[lVar15 + 1] != 'l') || (rhs[lVar15 + 2] != 't')) ||
                         (rhs[lVar15 + 3] != ';')) goto LAB_00110b7c;
                      rhs[uVar17] = '<';
                    }
                    goto LAB_00110c87;
                  }
LAB_00110b7c:
                  iVar10 = iVar13 + 5;
                  if (iVar10 < iVar5) {
                    if (rhs[lVar15 + 1] == 'a') {
                      if ((((rhs[lVar15 + 2] != 'p') || (rhs[lVar15 + 3] != 'o')) ||
                          (rhs[lVar15 + 4] != 's')) || (rhs[lVar15 + 5] != ';')) goto LAB_00110bf3;
                      rhs[uVar17] = '\'';
                    }
                    else {
                      if (((rhs[lVar15 + 1] != 'q') || (rhs[lVar15 + 2] != 'u')) ||
                         ((rhs[lVar15 + 3] != 'o' ||
                          ((rhs[lVar15 + 4] != 't' || (rhs[lVar15 + 5] != ';'))))))
                      goto LAB_00110bf3;
                      rhs[uVar17] = '\"';
                    }
                  }
                  else {
LAB_00110bf3:
                    iVar10 = iVar13 + 4;
                    if (((iVar10 < iVar5) && (rhs[lVar15 + 1] == 'a')) &&
                       ((rhs[lVar15 + 2] == 'm' &&
                        ((rhs[lVar15 + 3] == 'p' && (rhs[lVar15 + 4] == ';')))))) {
                      rhs[uVar17] = '&';
                    }
                    else if ((iVar12 < iVar5) &&
                            ((rhs[lVar15 + 1] == '#' &&
                             ((*(byte *)((long)*local_980 + (long)rhs[lVar15 + 2] * 2 + 1) & 8) != 0
                             )))) {
                      val = 0x3f;
                      iVar10 = iVar5;
                      if (iVar5 < iVar12) {
                        iVar10 = iVar12;
                      }
                      uVar9 = (iVar10 - iVar13) - 3;
                      uVar18 = 0x38U - iVar13;
                      if (uVar9 < 0x38U - iVar13) {
                        uVar18 = uVar9;
                      }
                      __isoc99_sscanf(rhs + lVar15 + 2,"%u",&val);
                      rhs[uVar17] = (char)val;
                      iVar10 = uVar18 + iVar12;
                    }
                    else {
                      if ((iVar5 <= iVar10) ||
                         (((rhs[lVar15 + 1] != '#' || (rhs[lVar15 + 2] != 'x')) ||
                          ((*(byte *)((long)*local_980 + (long)rhs[lVar15 + 3] * 2 + 1) & 0x10) == 0
                          )))) goto LAB_00110c77;
                      val = 0x3f;
                      iVar12 = iVar5;
                      if (iVar5 < iVar10) {
                        iVar12 = iVar10;
                      }
                      uVar9 = (iVar12 - iVar13) - 4;
                      uVar18 = 0x37U - iVar13;
                      if (uVar9 < 0x37U - iVar13) {
                        uVar18 = uVar9;
                      }
                      __isoc99_sscanf(rhs + lVar15 + 3,"%x",&val);
                      rhs[uVar17] = (char)val;
                      iVar10 = uVar18 + iVar10;
                    }
                  }
                }
                else {
LAB_00110c77:
                  iVar10 = iVar13;
                  if ((long)uVar17 < lVar15) {
                    rhs[uVar17] = cVar1;
                  }
                }
LAB_00110c87:
                iVar13 = iVar10 + 1;
                uVar17 = uVar17 + 1;
              } while (iVar13 < iVar5);
            }
            if ((int)uVar17 < iVar5) {
              rhs[uVar17 & 0xffffffff] = '\0';
            }
          }
          if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(lhs[6],
                                                  CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3]))))))) ==
              0x657079745f6974 &&
              CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3],
                                                  CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
              0x79745f697466696e) {
            if (rhs._8_4_ == 0x352e37 && rhs._0_8_ == 0x2d455a594c414e41) {
              nim->nifti_type = 0;
            }
            else if (rhs[8] == '\0' && rhs._0_8_ == 0x2b312d495446494e) {
              nim->nifti_type = 1;
            }
            else if (rhs._0_8_ == 0x312d495446494e) {
              nim->nifti_type = 2;
            }
            else if (rhs[8] == '\0' && rhs._0_8_ == 0x41312d495446494e) {
              nim->nifti_type = 3;
            }
          }
          else {
            auVar21[0] = -(lhs[0] == 'h');
            auVar21[1] = -(lhs[1] == 'e');
            auVar21[2] = -(lhs[2] == 'a');
            auVar21[3] = -(lhs[3] == 'd');
            auVar21[4] = -(lhs[4] == 'e');
            auVar21[5] = -(lhs[5] == 'r');
            auVar21[6] = -(lhs[6] == '_');
            auVar21[7] = -(lhs[7] == 'f');
            auVar21[8] = -(lhs[8] == 'i');
            auVar21[9] = -(lhs[9] == 'l');
            auVar21[10] = -(lhs[10] == 'e');
            auVar21[0xb] = -(lhs[0xb] == 'n');
            auVar21[0xc] = -(lhs[0xc] == 'a');
            auVar21[0xd] = -(lhs[0xd] == 'm');
            auVar21[0xe] = -(lhs[0xe] == 'e');
            auVar21[0xf] = -(lhs[0xf] == '\0');
            if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
              pcVar11 = nifti_strdup(rhs);
              nim->fname = pcVar11;
            }
            else if (CONCAT17(lhs[0xe],CONCAT16(lhs[0xd],CONCAT15(lhs[0xc],CONCAT14(lhs[0xb],
                                                  CONCAT13(lhs[10],CONCAT12(lhs[9],CONCAT11(lhs[8],
                                                  lhs[7]))))))) == 0x656d616e656c69 &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x69665f6567616d69) {
              pcVar11 = nifti_strdup(rhs);
              nim->iname = pcVar11;
            }
            else if (CONCAT17(lhs[0xe],CONCAT16(lhs[0xd],CONCAT15(lhs[0xc],CONCAT14(lhs[0xb],
                                                  CONCAT13(lhs[10],CONCAT12(lhs[9],CONCAT11(lhs[8],
                                                  lhs[7]))))))) == 0x78697274616d5f &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x5f7a79785f6f7473) {
              __isoc99_sscanf(rhs,"%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f",local_898,
                              local_8a0,local_8a8,local_8b0,local_8b8,local_8c0,local_8c8,local_8d0,
                              local_8d8,local_8e0,local_8e8,local_8f0,local_8f8,local_900,
                              (int)local_908,(int)local_910);
            }
            else if (CONCAT11(lhs[9],lhs[8]) == 0x72 &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x6564726f65747962) {
              if (rhs._8_2_ == 0x54 && rhs._0_8_ == 0x535249465f42534d) {
                nim->byteorder = 2;
              }
              if (rhs._8_2_ == 0x54 && rhs._0_8_ == 0x535249465f42534c) {
                nim->byteorder = 1;
              }
            }
            else if (CONCAT17(lhs[0xc],CONCAT16(lhs[0xb],CONCAT15(lhs[10],CONCAT14(lhs[9],CONCAT13(
                                                  lhs[8],CONCAT12(lhs[7],CONCAT11(lhs[6],lhs[5])))))
                                               )) == 0x74657366666f5f &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x666f5f6567616d69) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->iname_offset = (int)dVar20;
            }
            else if (lhs[8] == '\0' &&
                     CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3]
                                                  ,CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))))))) ==
                     0x6570797461746164) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->datatype = (int)(short)(int)dVar20;
            }
            else if (lhs[4] == '\0' &&
                     CONCAT13(lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))) == 0x6d69646e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->ndim = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x786e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->nx = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x796e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->ny = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7a6e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->nz = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x746e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->nt = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x756e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->nu = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x766e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->nv = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x776e) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->nw = (int)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7864) {
              dVar20 = strtod(rhs,(char **)0x0);
              *local_920 = (float)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7964) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->dy = (float)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7a64) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->dz = (float)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7464) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->dt = (float)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7564) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->du = (float)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7664) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->dv = (float)dVar20;
            }
            else if (lhs[2] == '\0' && CONCAT11(lhs[1],lhs[0]) == 0x7764) {
              dVar20 = strtod(rhs,(char **)0x0);
              nim->dw = (float)dVar20;
            }
            else {
              lVar15 = CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))));
              if (lVar15 == 0x78616d5f6c6163) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->cal_max = (float)dVar20;
              }
              else if (lVar15 == 0x6e696d5f6c6163) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->cal_min = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x65 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x706f6c735f6c6373) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->scl_slope = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x72 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x65746e695f6c6373) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->scl_inter = (float)dVar20;
              }
              else if (CONCAT13(lhs[0xb],CONCAT12(lhs[10],CONCAT11(lhs[9],lhs[8]))) == 0x65646f &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x635f746e65746e69) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->intent_code = (int)(short)(int)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x31 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x705f746e65746e69) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->intent_p1 = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x32 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x705f746e65746e69) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->intent_p2 = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x33 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x705f746e65746e69) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->intent_p3 = (float)dVar20;
              }
              else if (CONCAT13(lhs[0xb],CONCAT12(lhs[10],CONCAT11(lhs[9],lhs[8]))) == 0x656d61 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x6e5f746e65746e69) {
                strncpy(local_928,rhs,0xf);
                nim->intent_name[0xf] = '\0';
              }
              else if (lVar15 == 0x74657366666f74) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->toffset = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x73 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x74696e755f7a7978) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->xyz_units = (int)dVar20;
              }
              else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(lhs
                                                  [6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))))
                       == 0x7374696e755f65 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x696e755f656d6974) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->time_units = (int)dVar20;
              }
              else if (lVar15 == 0x70697263736564) {
                strncpy(local_930,rhs,0x4f);
                nim->descrip[0x4f] = '\0';
              }
              else if (lhs[8] == '\0' &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x656c69665f787561) {
                strncpy(local_938,rhs,0x17);
                nim->aux_file[0x17] = '\0';
              }
              else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(lhs
                                                  [6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))))
                       == 0x65646f635f6d72 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x6f635f6d726f6671) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->qform_code = (int)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x62 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x5f6e726574617571) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->quatern_b = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 99 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x5f6e726574617571) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->quatern_c = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 100 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x5f6e726574617571) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->quatern_d = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x78 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x5f74657366666f71) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->qoffset_x = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x79 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x5f74657366666f71) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->qoffset_y = (float)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x7a &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x5f74657366666f71) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->qoffset_z = (float)dVar20;
              }
              else if (lhs[4] == '\0' &&
                       CONCAT13(lhs[3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0]))) == 0x63616671) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->qfac = (float)dVar20;
              }
              else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(lhs
                                                  [6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))))
                       == 0x65646f635f6d72 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x6f635f6d726f6673) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->sform_code = (int)dVar20;
              }
              else if (lhs[8] == '\0' &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x6d69645f71657266) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->freq_dim = (int)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x6d &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x69645f6573616870) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->phase_dim = (int)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 0x6d &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x69645f6563696c73) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->slice_dim = (int)dVar20;
              }
              else if (CONCAT17(lhs[10],CONCAT16(lhs[9],CONCAT15(lhs[8],CONCAT14(lhs[7],CONCAT13(lhs
                                                  [6],CONCAT12(lhs[5],CONCAT11(lhs[4],lhs[3])))))))
                       == 0x65646f635f6563 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x6f635f6563696c73) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->slice_code = (int)dVar20;
              }
              else if (CONCAT13(lhs[0xb],CONCAT12(lhs[10],CONCAT11(lhs[9],lhs[8]))) == 0x747261 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x74735f6563696c73) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->slice_start = (int)dVar20;
              }
              else if (CONCAT11(lhs[9],lhs[8]) == 100 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x6e655f6563696c73) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->slice_end = (int)dVar20;
              }
              else if (CONCAT17(lhs[0xe],CONCAT16(lhs[0xd],CONCAT15(lhs[0xc],CONCAT14(lhs[0xb],
                                                  CONCAT13(lhs[10],CONCAT12(lhs[9],CONCAT11(lhs[8],
                                                  lhs[7]))))))) == 0x6e6f6974617275 &&
                       CONCAT17(lhs[7],CONCAT16(lhs[6],CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[
                                                  3],CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))))
                       == 0x75645f6563696c73) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->slice_duration = (float)dVar20;
              }
              else if (lVar15 == 0x7478655f6d756e) {
                dVar20 = strtod(rhs,(char **)0x0);
                nim->num_ext = (int)dVar20;
              }
            }
          }
        }
        uVar17 = (ulong)(local_984 + uVar14);
        goto LAB_00111d3d;
      }
      nifti_image_from_ascii_cold_1();
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image *nifti_image_from_ascii( const char *str, int * bytes_read )
{
   char lhs[1024] , rhs[1024] ;
   int ii , spos, nn ;
   nifti_image *nim ;              /* will be output */

   if( str == NULL || *str == '\0' ) return NULL ;  /* bad input!? */

   /* scan for opening string */

   spos = 0 ; 
   ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
   if( ii == 0 || strcmp(lhs,"<nifti_image") != 0 ) return NULL ;

   /* create empty image struct */

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ){
      fprintf(stderr,"** NIFA: failed to alloc nifti_image\n");
      return NULL;
   }

   nim->nx = nim->ny = nim->nz = nim->nt
           = nim->nu = nim->nv = nim->nw = 1 ;
   nim->dx = nim->dy = nim->dz = nim->dt
           = nim->du = nim->dv = nim->dw = 0 ;
   nim->qfac = 1.0f ;

   nim->byteorder = nifti_short_order() ;

   /* starting at str[spos], scan for "equations" of the form
         lhs = 'rhs'
      and assign rhs values into the struct component named by lhs */

   while(1){

     while( isspace((int) str[spos]) ) spos++ ;  /* skip whitespace */
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* get lhs string */

     ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
     if( ii == 0 || strcmp(lhs,"/>") == 0 ) break ;  /* end of input? */

     /* skip whitespace and the '=' marker */

     while( isspace((int) str[spos]) || str[spos] == '=' ) spos++ ;
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* if next character is a quote ', copy everything up to next '
        otherwise, copy everything up to next nonblank              */

     if( str[spos] == '\'' ){
        ii = spos+1 ;
        while( str[ii] != '\0' && str[ii] != '\'' ) ii++ ;
        nn = ii-spos-1 ; if( nn > 1023 ) nn = 1023 ;
        memcpy(rhs,str+spos+1,nn) ; rhs[nn] = '\0' ;
        spos = (str[ii] == '\'') ? ii+1 : ii ;
     } else {
        ii = sscanf( str+spos , "%1023s%n" , rhs , &nn ) ; spos += nn ;
        if( ii == 0 ) break ;  /* nothing found? */
     }
     unescape_string(rhs) ;  /* remove any XML escape sequences */

     /* Now can do the assignment, based on lhs string.
        Start with special cases that don't fit the QNUM/QSTR macros. */

     if( strcmp(lhs,"nifti_type") == 0 ){
            if( strcmp(rhs,"ANALYZE-7.5") == 0 )
               nim->nifti_type = NIFTI_FTYPE_ANALYZE ;
       else if( strcmp(rhs,"NIFTI-1+")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_1 ;
       else if( strcmp(rhs,"NIFTI-1")     == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_2 ;
       else if( strcmp(rhs,"NIFTI-1A")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_ASCII ;
     }
     else if( strcmp(lhs,"header_filename") == 0 ){
       nim->fname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"image_filename") == 0 ){
       nim->iname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"sto_xyz_matrix") == 0 ){
       sscanf( rhs , "%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f" ,
               &(nim->sto_xyz.m[0][0]) , &(nim->sto_xyz.m[0][1]) ,
               &(nim->sto_xyz.m[0][2]) , &(nim->sto_xyz.m[0][3]) ,
               &(nim->sto_xyz.m[1][0]) , &(nim->sto_xyz.m[1][1]) ,
               &(nim->sto_xyz.m[1][2]) , &(nim->sto_xyz.m[1][3]) ,
               &(nim->sto_xyz.m[2][0]) , &(nim->sto_xyz.m[2][1]) ,
               &(nim->sto_xyz.m[2][2]) , &(nim->sto_xyz.m[2][3]) ,
               &(nim->sto_xyz.m[3][0]) , &(nim->sto_xyz.m[3][1]) ,
               &(nim->sto_xyz.m[3][2]) , &(nim->sto_xyz.m[3][3])  ) ;
     }
     else if( strcmp(lhs,"byteorder") == 0 ){
       if( strcmp(rhs,"MSB_FIRST") == 0 ) nim->byteorder = MSB_FIRST ;
       if( strcmp(rhs,"LSB_FIRST") == 0 ) nim->byteorder = LSB_FIRST ;
     }
     else QQNUM(image_offset,iname_offset,int) ;
     else QNUM(datatype,short int) ;
     else QNUM(ndim,int) ;
     else QNUM(nx,int) ;
     else QNUM(ny,int) ;
     else QNUM(nz,int) ;
     else QNUM(nt,int) ;
     else QNUM(nu,int) ;
     else QNUM(nv,int) ;
     else QNUM(nw,int) ;
     else QNUM(dx,float) ;
     else QNUM(dy,float) ;
     else QNUM(dz,float) ;
     else QNUM(dt,float) ;
     else QNUM(du,float) ;
     else QNUM(dv,float) ;
     else QNUM(dw,float) ;
     else QNUM(cal_min,float) ;
     else QNUM(cal_max,float) ;
     else QNUM(scl_slope,float) ;
     else QNUM(scl_inter,float) ;
     else QNUM(intent_code,short) ;
     else QNUM(intent_p1,float) ;
     else QNUM(intent_p2,float) ;
     else QNUM(intent_p3,float) ;
     else QSTR(intent_name,15) ;
     else QNUM(toffset,float) ;
     else QNUM(xyz_units,int) ;
     else QNUM(time_units,int) ;
     else QSTR(descrip,79) ;
     else QSTR(aux_file,23) ;
     else QNUM(qform_code,int) ;
     else QNUM(quatern_b,float) ;
     else QNUM(quatern_c,float) ;
     else QNUM(quatern_d,float) ;
     else QNUM(qoffset_x,float) ;
     else QNUM(qoffset_y,float) ;
     else QNUM(qoffset_z,float) ;
     else QNUM(qfac,float) ;
     else QNUM(sform_code,int) ;
     else QNUM(freq_dim,int) ;
     else QNUM(phase_dim,int) ;
     else QNUM(slice_dim,int) ;
     else QNUM(slice_code,int) ;
     else QNUM(slice_start,int) ;
     else QNUM(slice_end,int) ;
     else QNUM(slice_duration,float) ;
     else QNUM(num_ext,int) ;

   } /* end of while loop */

   if( bytes_read ) *bytes_read = spos+1;         /* "process" last '\n' */

   /* do miscellaneous checking and cleanup */

   if( nim->ndim <= 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nifti_datatype_sizes( nim->datatype, &(nim->nbyper), &(nim->swapsize) );
   if( nim->nbyper == 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nim->dim[0] = nim->ndim ;
   nim->dim[1] = nim->nx ; nim->pixdim[1] = nim->dx ;
   nim->dim[2] = nim->ny ; nim->pixdim[2] = nim->dy ;
   nim->dim[3] = nim->nz ; nim->pixdim[3] = nim->dz ;
   nim->dim[4] = nim->nt ; nim->pixdim[4] = nim->dt ;
   nim->dim[5] = nim->nu ; nim->pixdim[5] = nim->du ;
   nim->dim[6] = nim->nv ; nim->pixdim[6] = nim->dv ;
   nim->dim[7] = nim->nw ; nim->pixdim[7] = nim->dw ;

   nim->nvox = (size_t)nim->nx * nim->ny * nim->nz
                     * nim->nt * nim->nu * nim->nv * nim->nw ;

   if( nim->qform_code > 0 )
     nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;
   else
     nim->qto_xyz = nifti_quatern_to_mat44(
                      0.0f , 0.0f , 0.0f , 0.0f , 0.0f , 0.0f ,
                      nim->dx , nim->dy , nim->dz , 0.0f ) ;


   nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

   if( nim->sform_code > 0 )
     nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

   return nim ;
}